

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_test.c
# Opt level: O2

void test_url_path_anchor(void)

{
  nng_err num;
  int iVar1;
  uint32_t uVar2;
  char *pcVar3;
  char *pcVar4;
  nng_url *local_30;
  nng_url *url;
  
  num = nng_url_parse(&local_30,"http://www.google.com/somewhere#chapter2");
  pcVar3 = nng_strerror(num);
  iVar1 = acutest_check_((uint)(num == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                         ,0x9f,"%s: expected success, got %s (%d)",
                         "nng_url_parse(&url, \"http://www.google.com/somewhere#chapter2\")",pcVar3,
                         num);
  if (iVar1 != 0) {
    iVar1 = acutest_check_((uint)(local_30 != (nng_url *)0x0),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                           ,0xa0,"%s","url != NULL");
    if (iVar1 != 0) {
      pcVar3 = nng_url_scheme(local_30);
      iVar1 = strcmp(pcVar3,"http");
      pcVar3 = nng_url_scheme(local_30);
      acutest_check_((uint)(iVar1 == 0),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                     ,0xa1,"%s == %s",pcVar3,"http");
      pcVar3 = nng_url_hostname(local_30);
      iVar1 = strcmp(pcVar3,"www.google.com");
      pcVar3 = nng_url_hostname(local_30);
      acutest_check_((uint)(iVar1 == 0),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                     ,0xa2,"%s == %s",pcVar3,"www.google.com");
      uVar2 = nng_url_port(local_30);
      acutest_check_((uint)(uVar2 == 0x50),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                     ,0xa3,"%s","nng_url_port(url) == 80");
      pcVar3 = nng_url_path(local_30);
      iVar1 = strcmp(pcVar3,"/somewhere");
      pcVar3 = nng_url_path(local_30);
      acutest_check_((uint)(iVar1 == 0),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                     ,0xa4,"%s == %s",pcVar3,"/somewhere");
      pcVar3 = nng_url_fragment(local_30);
      iVar1 = strcmp(pcVar3,"chapter2");
      pcVar3 = nng_url_fragment(local_30);
      acutest_check_((uint)(iVar1 == 0),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                     ,0xa5,"%s == %s",pcVar3,"chapter2");
      pcVar3 = nng_url_query(local_30);
      pcVar4 = nng_url_query(local_30);
      acutest_check_((uint)(pcVar3 == (char *)0x0),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                     ,0xa6,"%p == NULL",pcVar4);
      pcVar3 = nng_url_userinfo(local_30);
      pcVar4 = nng_url_userinfo(local_30);
      acutest_check_((uint)(pcVar3 == (char *)0x0),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                     ,0xa7,"%p == NULL",pcVar4);
      nng_url_free(local_30);
      return;
    }
  }
  acutest_abort_();
}

Assistant:

void
test_url_path_anchor(void)
{
	nng_url *url;
	NUTS_PASS(
	    nng_url_parse(&url, "http://www.google.com/somewhere#chapter2"));
	NUTS_ASSERT(url != NULL);
	NUTS_MATCH(nng_url_scheme(url), "http");
	NUTS_MATCH(nng_url_hostname(url), "www.google.com");
	NUTS_TRUE(nng_url_port(url) == 80);
	NUTS_MATCH(nng_url_path(url), "/somewhere");
	NUTS_MATCH(nng_url_fragment(url), "chapter2");
	NUTS_NULL(nng_url_query(url));
	NUTS_NULL(nng_url_userinfo(url));
	nng_url_free(url);
}